

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqPubSub.cpp
# Opt level: O2

void __thiscall
adios2::zmq::ZmqPubSub::OpenSubscriber(ZmqPubSub *this,string *address,size_t bufferSize)

{
  int iVar1;
  void *pvVar2;
  allocator local_9c;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  pvVar2 = (void *)zmq_ctx_new();
  this->m_ZmqContext = pvVar2;
  if (pvVar2 == (void *)0x0) {
    std::__cxx11::string::string((string *)&local_38,"Toolkit",&local_99);
    std::__cxx11::string::string((string *)&local_58,"ZmqPubSub",&local_9a);
    std::__cxx11::string::string((string *)&local_78,"OpenSubscriber",&local_9b);
    std::__cxx11::string::string((string *)&local_98,"creating zmq context failed",&local_9c);
    helper::Throw<std::runtime_error>(&local_38,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    pvVar2 = this->m_ZmqContext;
  }
  pvVar2 = (void *)zmq_socket(pvVar2,2);
  this->m_ZmqSocket = pvVar2;
  if (pvVar2 == (void *)0x0) {
    std::__cxx11::string::string((string *)&local_38,"Toolkit",&local_99);
    std::__cxx11::string::string((string *)&local_58,"ZmqPubSub",&local_9a);
    std::__cxx11::string::string((string *)&local_78,"OpenSubscriber",&local_9b);
    std::__cxx11::string::string((string *)&local_98,"creating zmq socket failed",&local_9c);
    helper::Throw<std::runtime_error>(&local_38,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    pvVar2 = this->m_ZmqSocket;
  }
  iVar1 = zmq_connect(pvVar2,(address->_M_dataplus)._M_p);
  if (iVar1 != 0) {
    std::__cxx11::string::string((string *)&local_38,"Toolkit",&local_99);
    std::__cxx11::string::string((string *)&local_58,"ZmqPubSub",&local_9a);
    std::__cxx11::string::string((string *)&local_78,"OpenSubscriber",&local_9b);
    std::__cxx11::string::string((string *)&local_98,"connecting zmq socket failed",&local_9c);
    helper::Throw<std::runtime_error>(&local_38,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  zmq_setsockopt(this->m_ZmqSocket,6,"",0);
  std::vector<char,_std::allocator<char>_>::resize(&this->m_ReceiverBuffer,bufferSize);
  return;
}

Assistant:

void ZmqPubSub::OpenSubscriber(const std::string &address, const size_t bufferSize)
{
    m_ZmqContext = zmq_ctx_new();
    if (not m_ZmqContext)
    {
        helper::Throw<std::runtime_error>("Toolkit", "ZmqPubSub", "OpenSubscriber",
                                          "creating zmq context failed");
    }

    m_ZmqSocket = zmq_socket(m_ZmqContext, ZMQ_SUB);
    if (not m_ZmqSocket)
    {
        helper::Throw<std::runtime_error>("Toolkit", "ZmqPubSub", "OpenSubscriber",
                                          "creating zmq socket failed");
    }

    int error = zmq_connect(m_ZmqSocket, address.c_str());
    if (error)
    {
        helper::Throw<std::runtime_error>("Toolkit", "ZmqPubSub", "OpenSubscriber",
                                          "connecting zmq socket failed");
    }

    zmq_setsockopt(m_ZmqSocket, ZMQ_SUBSCRIBE, "", 0);

    m_ReceiverBuffer.resize(bufferSize);
}